

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
boost::numeric::ublas::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,
          vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
          *v)

{
  ulong uVar1;
  long lVar2;
  char *__s;
  ostream *poVar3;
  size_t sVar4;
  ulong uVar5;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> s;
  locale local_1d0;
  undefined7 uStack_1cf;
  long local_1c0 [2];
  locale local_1b0 [8];
  long local_1a8;
  undefined8 local_1a0 [2];
  undefined4 auStack_190 [22];
  ios_base local_138 [264];
  
  uVar1 = *(ulong *)(*(long *)v + 8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  lVar2 = *(long *)os;
  *(undefined4 *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
       *(undefined4 *)(os + *(long *)(lVar2 + -0x18) + 0x18);
  std::locale::locale(&local_1d0,(locale *)(os + *(long *)(lVar2 + -0x18) + 0xd0));
  std::ios::imbue(local_1b0);
  std::locale::~locale(local_1b0);
  std::locale::~locale(&local_1d0);
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) =
       *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8);
  local_1d0 = (locale)0x5b;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_1a8,(char *)&local_1d0,1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"](",2);
  if (uVar1 != 0) {
    std::ostream::_M_insert<double>
              (*(double *)
                (*(long *)(*(long *)v + 0x20) + *(long *)(*(long *)v + 8) * *(long *)(v + 8) * 8));
  }
  if (1 < uVar1) {
    uVar5 = 1;
    do {
      local_1d0 = (locale)0x2c;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,(char *)&local_1d0,1)
      ;
      std::ostream::_M_insert<double>
                (*(double *)
                  (*(long *)(*(long *)v + 8) * *(long *)(v + 8) * 8 + *(long *)(*(long *)v + 0x20) +
                  uVar5 * 8));
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  local_1d0 = (locale)0x29;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,(char *)&local_1d0,1);
  std::__cxx11::stringbuf::str();
  __s = (char *)CONCAT71(uStack_1cf,local_1d0);
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,__s,sVar4);
  }
  if ((long *)CONCAT71(uStack_1cf,local_1d0) != local_1c0) {
    operator_delete((long *)CONCAT71(uStack_1cf,local_1d0),local_1c0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return os;
}

Assistant:

std::basic_ostream<E, T> &operator << (std::basic_ostream<E, T> &os,
                                           const vector_expression<VE> &v) {
        typedef typename VE::size_type size_type;
        size_type size = v ().size ();
        std::basic_ostringstream<E, T, std::allocator<E> > s;
        s.flags (os.flags ());
        s.imbue (os.getloc ());
        s.precision (os.precision ());
        s << '[' << size << "](";
        if (size > 0)
            s << v () (0);
        for (size_type i = 1; i < size; ++ i)
            s << ',' << v () (i);
        s << ')';
        return os << s.str ().c_str ();
    }